

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_append(char *dst,char *src,int dst_size)

{
  char cVar1;
  size_t sVar2;
  long lVar3;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
                 ,0x823,(uint)(0 < dst_size),"dst_size invalid");
  sVar2 = strlen(dst);
  lVar3 = (long)(int)sVar2;
  for (; (lVar3 < dst_size && (cVar1 = *src, dst[lVar3] = cVar1, cVar1 != '\0')); src = src + 1) {
    lVar3 = lVar3 + 1;
  }
  dst[(long)dst_size + -1] = '\0';
  return;
}

Assistant:

void str_append(char *dst, const char *src, int dst_size)
{
	int s;
	int i = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");
	s = str_length(dst);
	while(s < dst_size)
	{
		dst[s] = src[i];
		if(!src[i]) /* check for null termination */
			break;
		s++;
		i++;
	}

	dst[dst_size-1] = 0; /* assure null termination */
}